

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall
AmpIO::WriteWaveformTable(AmpIO *this,quadlet_t *buffer,unsigned_short offset,unsigned_short nquads)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if ((uVar2 < 7) || (uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this), uVar2 == 0x64524131)) {
    return false;
  }
  if (nquads == 0) {
    return true;
  }
  uVar3 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x1a])();
  if (0x3ff < offset) {
    return false;
  }
  if (uVar3 >> 2 < (uint)nquads) {
    return false;
  }
  lVar5 = 0;
  do {
    uVar3 = *(uint *)((long)buffer + lVar5) ^ 0xf;
    *(uint *)((long)WriteWaveformTable::localBuffer + lVar5) =
         *(uint *)((long)buffer + lVar5) >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
         uVar3 << 0x18;
    lVar5 = lVar5 + 4;
  } while ((ulong)nquads * 4 != lVar5);
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  iVar4 = (*pBVar1->_vptr_BasePort[0x27])
                    (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                     (ulong)(offset | 0x8000),WriteWaveformTable::localBuffer);
  return SUB41(iVar4,0);
}

Assistant:

bool AmpIO::WriteWaveformTable(const quadlet_t *buffer, unsigned short offset, unsigned short nquads)
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == dRA1_String) return false;

    if (nquads == 0) return true;
    if (nquads > (port->GetMaxWriteDataSize()/sizeof(quadlet_t))) return false;
    if (offset > 1023) return false;
    static quadlet_t localBuffer[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    nodeaddr_t address = 0x8000 + offset;   // ADDR_WAVEFORM = 0x8000
    // Byteswap and invert digital output bits (see WriteDigitalOutput and GetDigitalOutput)
    for (unsigned short i = 0; i < nquads; i++)
        localBuffer[i] = bswap_32(buffer[i]^0x0000000f);
    return port->WriteBlock(BoardId, address, localBuffer, nquads*sizeof(quadlet_t));
}